

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void output_defines(void)

{
  char *pcVar1;
  FILE *__s;
  FILE *pFVar2;
  int iVar3;
  char *pcVar4;
  ushort **ppuVar5;
  char cVar6;
  long lVar7;
  
  if (dflag != '\0') {
    pcVar4 = strdup(defines_file_name);
    cVar6 = *pcVar4;
    if (cVar6 != '\0') {
      ppuVar5 = __ctype_b_loc();
      pcVar1 = pcVar4;
      do {
        if (((*ppuVar5)[cVar6] & 8) == 0) {
          *pcVar1 = '_';
        }
        cVar6 = pcVar1[1];
        pcVar1 = pcVar1 + 1;
      } while (cVar6 != '\0');
    }
    fprintf((FILE *)defines_file,"#ifndef _%s_\n",pcVar4);
    fprintf((FILE *)defines_file,"#define _%s_\n\n",pcVar4);
    free(pcVar4);
  }
  pFVar2 = defines_file;
  __s = (FILE *)code_file;
  if ((dflag != '\0') && (__s = (FILE *)pFVar2, include_defines == '\0')) {
    outline = outline + 2;
    fprintf((FILE *)code_file,"#include \"%s\"\n\n",defines_file_name);
    include_defines = '\x01';
  }
  if (2 < ntokens) {
    lVar7 = 2;
    do {
      pcVar4 = symbol_name[lVar7];
      iVar3 = is_C_identifier(pcVar4);
      if (iVar3 != 0) {
        fwrite("#define ",8,1,__s);
        cVar6 = *pcVar4;
        if (cVar6 == '\"') {
          cVar6 = pcVar4[1];
          if (cVar6 != '\"') {
            pcVar4 = pcVar4 + 2;
            do {
              putc((int)cVar6,__s);
              cVar6 = *pcVar4;
              pcVar4 = pcVar4 + 1;
            } while (cVar6 != '\"');
          }
        }
        else {
          do {
            pcVar4 = pcVar4 + 1;
            putc((int)cVar6,__s);
            cVar6 = *pcVar4;
          } while (cVar6 != '\0');
        }
        if (dflag == '\0') {
          outline = outline + 1;
        }
        fprintf(__s," %d\n",(ulong)(uint)symbol_value[lVar7]);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < ntokens);
  }
  if (dflag == '\0') {
    outline = outline + 1;
  }
  fprintf(__s,"#define YYERRCODE %d\n",(ulong)(uint)symbol_value[1]);
  if ((dflag != '\0') && (location_defined != '\0' || unionized != '\0')) {
    fclose((FILE *)union_file);
    union_file = (FILE *)fopen(union_file_name,"r");
    if ((FILE *)union_file == (FILE *)0x0) {
      open_error(union_file_name);
    }
    while (iVar3 = getc((FILE *)union_file), iVar3 != -1) {
      putc(iVar3,(FILE *)defines_file);
    }
    if (unionized != '\0') {
      fprintf((FILE *)defines_file,"extern YYSTYPE %slval;\n",symbol_prefix);
    }
  }
  if (dflag != '\0') {
    fwrite("#if defined(YYPOSN)\nextern YYPOSN yyposn;\n#endif\n",0x31,1,(FILE *)defines_file);
    fwrite("\n#endif\n",8,1,(FILE *)defines_file);
    return;
  }
  return;
}

Assistant:

void output_defines()
{
    register int c, i;
    register char *s;
    FILE *dc_file;

    if(dflag) {
	char *p, *tmp = strdup(defines_file_name);
	for (p = tmp; *p; p++)
	    if (!isalnum(*p))
		*p = '_';
	fprintf(defines_file, "#ifndef _%s_\n", tmp);
	fprintf(defines_file, "#define _%s_\n\n", tmp);
	free(tmp);
    }

    /* VM: Print to either code file or defines file but not to both */
    dc_file = dflag ? defines_file : code_file;
    if (dflag && !include_defines) {
	outline += 2;
	fprintf(code_file, "#include \"%s\"\n\n", defines_file_name);
	include_defines = 1; }

    for (i = 2; i < ntokens; ++i)
    {
	s = symbol_name[i];
	if (is_C_identifier(s))
	{
	    fprintf(dc_file, "#define ");
	    c = *s;
	    if (c == '"')
	    {
		while ((c = *++s) != '"')
		{
		    putc(c, dc_file);
		}
	    }
	    else
	    {
		do
		{
		    putc(c, dc_file);
		}
		while ((c = *++s));
	    }
	    if (!dflag) ++outline;
	    fprintf(dc_file, " %d\n", symbol_value[i]);
	}
    }

    if (!dflag) ++outline;
    fprintf(dc_file, "#define YYERRCODE %d\n", symbol_value[1]);

    if (dflag && (unionized || location_defined))
    {
	fclose(union_file);
	union_file = fopen(union_file_name, "r");
	if (union_file == NULL) open_error(union_file_name);
	while ((c = getc(union_file)) != EOF) {
	  putc(c, defines_file);
	}
	if (unionized)
	    fprintf(defines_file, "extern YYSTYPE %slval;\n", symbol_prefix);
    }

    if(dflag) {
	fprintf(defines_file, "#if defined(YYPOSN)\n"
			      "extern YYPOSN yyposn;\n"
			      "#endif\n");
	fprintf(defines_file, "\n#endif\n");
    }
}